

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall
pbrt::Image::Image(Image *this,
                  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *p8c,
                  Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels,ColorEncodingHandle *encoding)

{
  memory_resource *pmVar1;
  int vb;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  ColorEncodingHandle *local_48;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *local_40;
  size_t va;
  
  this->format = U256;
  (this->resolution).super_Tuple2<pbrt::Point2,_int> = resolution.super_Tuple2<pbrt::Point2,_int>;
  local_48 = encoding;
  local_40 = p8c;
  va = (size_t)pstd::pmr::new_delete_resource();
  local_50 = &this->channelNames;
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  InlinedVector<std::__cxx11::string_const*>
            ((InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
              *)&this->channelNames,channels.ptr,channels.ptr + channels.n,
             (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&va);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (local_48->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            (&this->p8,local_40);
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->p16).alloc.memoryResource = pmVar1;
  (this->p16).nStored = 0;
  (this->p16).ptr = (Half *)0x0;
  (this->p16).nAlloc = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->p32).alloc.memoryResource = pmVar1;
  (this->p32).nStored = 0;
  (this->p32).ptr = (float *)0x0;
  (this->p32).nAlloc = 0;
  va = (this->p8).nStored;
  vb = resolution.super_Tuple2<pbrt::Point2,_int>.y * resolution.super_Tuple2<pbrt::Point2,_int>.x *
       (int)(this->channelNames).nStored;
  if (va == (long)vb) {
    return;
  }
  LogFatal<char_const(&)[10],char_const(&)[44],char_const(&)[10],unsigned_long&,char_const(&)[44],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x1d4,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"p8.size()",
             (char (*) [44])"NChannels() * resolution[0] * resolution[1]",(char (*) [10])"p8.size()"
             ,(unsigned_long *)&va,(char (*) [44])"NChannels() * resolution[0] * resolution[1]",&vb)
  ;
}

Assistant:

Image::Image(pstd::vector<uint8_t> p8c, Point2i resolution,
             pstd::span<const std::string> channels, ColorEncodingHandle encoding)
    : format(PixelFormat::U256),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      encoding(encoding),
      p8(std::move(p8c)) {
    CHECK_EQ(p8.size(), NChannels() * resolution[0] * resolution[1]);
}